

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# networkDataTypes.cpp
# Opt level: O3

bool __thiscall HighFreqDataType::operator<(HighFreqDataType *this,HighFreqDataType *obj)

{
  int iVar1;
  int iVar2;
  
  iVar1 = std::__cxx11::string::compare((string *)&this->name);
  iVar2 = std::__cxx11::string::compare((string *)&this->origin);
  return iVar2 < 1 && iVar1 < 1;
}

Assistant:

bool HighFreqDataType::operator <(const HighFreqDataType obj) const {
    bool retval = true;
    if (name > obj.name)
        retval = false;
    if (origin > obj.origin)
        retval = false;

    return(retval);
}